

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void temp_sync(TCGContext_conflict9 *s,TCGTemp *ts,TCGRegSet allocated_regs,TCGRegSet preferred_regs
              ,int free_or_dead)

{
  int *piVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  int opc;
  int iVar5;
  
  uVar3 = *(ulong *)ts;
  if ((uVar3 >> 0x20 & 1) != 0) {
    return;
  }
  if ((uVar3 >> 0x23 & 1) != 0) goto LAB_00b270c5;
  if ((uVar3 >> 0x24 & 1) == 0) {
    temp_allocate_frame(s,ts);
    uVar3 = *(ulong *)ts;
  }
  if ((char)(uVar3 >> 8) == '\x01') {
LAB_00b2709d:
    tcg_out_st(s,(TCGType_conflict)(uVar3 >> 0x18) & 0xff,(TCGReg)uVar3 & 0xff,
               (uint)*(byte *)ts->mem_base,ts->mem_offset);
  }
  else {
    uVar4 = (uint)(uVar3 >> 8) & 0xff;
    if (uVar4 != 2) {
      if (uVar4 != 3) {
        fprintf(_stderr,"%s:%d: tcg fatal error\n",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                ,0xb91);
        abort();
      }
      bVar2 = (byte)(uVar3 >> 0x18);
      if (free_or_dead == 0) {
LAB_00b2707e:
        temp_load(s,ts,s->tcg_target_available_regs[bVar2],allocated_regs,preferred_regs);
        uVar3 = *(ulong *)ts;
        goto LAB_00b2709d;
      }
      iVar5 = (int)ts->val;
      if (bVar2 == 0) {
        opc = 199;
      }
      else if ((bVar2 != 1) || (opc = 0x10c7, (long)iVar5 != ts->val)) goto LAB_00b2707e;
      tcg_out_modrm_offset(s,opc,0,(uint)*(byte *)ts->mem_base,ts->mem_offset);
      piVar1 = (int *)s->code_ptr;
      *piVar1 = iVar5;
      s->code_ptr = (tcg_insn_unit *)(piVar1 + 1);
    }
  }
  *(ulong *)ts = *(ulong *)ts | 0x800000000;
LAB_00b270c5:
  if (free_or_dead == 0) {
    return;
  }
  temp_free_or_dead(s,ts,free_or_dead);
  return;
}

Assistant:

static void temp_sync(TCGContext *s, TCGTemp *ts, TCGRegSet allocated_regs,
                      TCGRegSet preferred_regs, int free_or_dead)
{
    if (ts->fixed_reg) {
        return;
    }
    if (!ts->mem_coherent) {
        if (!ts->mem_allocated) {
            temp_allocate_frame(s, ts);
        }
        switch (ts->val_type) {
        case TEMP_VAL_CONST:
            /* If we're going to free the temp immediately, then we won't
               require it later in a register, so attempt to store the
               constant to memory directly.  */
            if (free_or_dead
                && tcg_out_sti(s, ts->type, ts->val,
                               ts->mem_base->reg, ts->mem_offset)) {
                break;
            }
            temp_load(s, ts, s->tcg_target_available_regs[ts->type],
                      allocated_regs, preferred_regs);
            /* fallthrough */

        case TEMP_VAL_REG:
            tcg_out_st(s, ts->type, ts->reg,
                       ts->mem_base->reg, ts->mem_offset);
            break;

        case TEMP_VAL_MEM:
            break;

        case TEMP_VAL_DEAD:
        default:
            tcg_abort();
        }
        ts->mem_coherent = 1;
    }
    if (free_or_dead) {
        temp_free_or_dead(s, ts, free_or_dead);
    }
}